

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

float __thiscall
tcu::ConstPixelBufferAccess::sample1DCompare
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float ref,float s,
          IVec2 *offset)

{
  WrapMode WVar1;
  int i;
  TextureChannelClass TVar2;
  uint uVar3;
  TextureChannelClass TVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vector<float,_4> res_2;
  Vec4 p0Clr;
  tcu local_78 [16];
  float local_68;
  undefined1 local_58 [16];
  TextureFormat local_48;
  int aiStack_40 [3];
  float local_34;
  
  local_68 = ref;
  TVar2 = getTextureChannelClass((this->m_format).type);
  if (sampler->normalizedCoords == true) {
    WVar1 = sampler->wrapS;
    if (WVar1 < WRAPMODE_LAST) {
      fVar13 = (float)(this->m_size).m_data[0];
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        if (WVar1 == REPEAT_CL) {
          fVar14 = floorf(s);
          fVar14 = s - fVar14;
        }
        else {
          local_34 = s * 0.5;
          fVar14 = floorf(local_34);
          fVar14 = local_34 - fVar14;
          if ((fVar14 != 0.5) || (NAN(fVar14))) {
            fVar15 = floorf(local_34 + 0.5);
          }
          else {
            fVar15 = 0.0;
            if (((long)(local_34 - fVar14) & 1U) != 0) {
              fVar15 = 1.0;
            }
            fVar15 = (local_34 - fVar14) + fVar15;
          }
          fVar14 = s - (fVar15 + fVar15);
          uVar12 = -(uint)(-fVar14 <= fVar14);
          fVar14 = (float)(~uVar12 & (uint)-fVar14 | (uint)fVar14 & uVar12);
        }
        s = fVar14 * fVar13;
      }
      else {
        s = s * fVar13;
      }
    }
    else {
      s = 0.0;
    }
  }
  if (filter != LINEAR) {
    if (filter != NEAREST) {
      return 0.0;
    }
    sampleNearest1D(local_78,this,sampler,s,offset);
    fVar13 = *(float *)(local_78 + (long)sampler->compareChannel * 4);
    if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      fVar14 = 1.0;
      if (fVar13 <= 1.0) {
        fVar14 = fVar13;
      }
      fVar13 = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar14);
    }
    if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      fVar14 = 1.0;
      if (local_68 <= 1.0) {
        fVar14 = local_68;
      }
      local_68 = (float)(~-(uint)(local_68 < 0.0) & (uint)fVar14);
    }
    switch(sampler->compare) {
    case COMPAREMODE_LESS:
      bVar10 = fVar13 < local_68;
      goto LAB_001eb2d2;
    case COMPAREMODE_LESS_OR_EQUAL:
      bVar10 = fVar13 < local_68;
      goto LAB_001eb2fb;
    case COMPAREMODE_GREATER:
      bVar10 = local_68 < fVar13;
LAB_001eb2d2:
      bVar10 = !bVar10 && local_68 != fVar13;
      break;
    case COMPAREMODE_GREATER_OR_EQUAL:
      bVar10 = local_68 < fVar13;
LAB_001eb2fb:
      bVar10 = !bVar10;
      break;
    case COMPAREMODE_EQUAL:
      bVar10 = local_68 == fVar13;
      break;
    case COMPAREMODE_NOT_EQUAL:
      bVar10 = local_68 != fVar13;
      break;
    case COMPAREMODE_ALWAYS:
      bVar10 = true;
      break;
    default:
      bVar10 = false;
    }
    if (!bVar10) {
      return 0.0;
    }
    return 1.0;
  }
  uVar12 = (this->m_size).m_data[0];
  fVar13 = floorf(s + -0.5);
  WVar1 = sampler->wrapS;
  uVar7 = 0;
  if (WVar1 < WRAPMODE_LAST) {
    uVar9 = offset->m_data[0] + (int)fVar13;
    uVar7 = uVar9;
    switch(WVar1) {
    default:
      uVar3 = uVar12 - 1;
      if ((int)uVar9 < (int)(uVar12 - 1)) {
        uVar3 = uVar9;
      }
      uVar7 = 0;
      if (-1 < (int)uVar9) {
        uVar7 = uVar3;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar3 = uVar12;
      if ((int)uVar9 < (int)uVar12) {
        uVar3 = uVar9;
      }
      uVar7 = 0xffffffff;
      if (-2 < (int)uVar9) {
        uVar7 = uVar3;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      uVar7 = ((int)uVar9 % (int)uVar12 >> 0x1f & uVar12) + (int)uVar9 % (int)uVar12;
      break;
    case MIRRORED_ONCE:
      uVar7 = uVar12;
      if ((int)uVar9 < (int)uVar12) {
        uVar7 = uVar9;
      }
      if (SBORROW4(uVar9,-uVar12) != (int)(uVar9 + uVar12) < 0) {
        uVar7 = -uVar12;
      }
    case MIRRORED_REPEAT_GL:
      iVar6 = (int)uVar7 % (int)(uVar12 * 2);
      uVar7 = (iVar6 - uVar12) + (iVar6 >> 0x1f & uVar12 * 2);
      uVar7 = ~((int)uVar7 >> 0x1f ^ uVar7) + uVar12;
    }
  }
  uVar9 = 0;
  if (WVar1 < WRAPMODE_LAST) {
    uVar3 = offset->m_data[0] + (int)fVar13 + 1;
    uVar9 = uVar3;
    switch(WVar1) {
    default:
      uVar8 = uVar12 - 1;
      if ((int)uVar3 < (int)(uVar12 - 1)) {
        uVar8 = uVar3;
      }
      uVar9 = 0;
      if (-1 < (int)uVar3) {
        uVar9 = uVar8;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar8 = uVar12;
      if ((int)uVar3 < (int)uVar12) {
        uVar8 = uVar3;
      }
      uVar9 = 0xffffffff;
      if (-2 < (int)uVar3) {
        uVar9 = uVar8;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      uVar9 = ((int)uVar3 % (int)uVar12 >> 0x1f & uVar12) + (int)uVar3 % (int)uVar12;
      break;
    case MIRRORED_ONCE:
      uVar9 = uVar12;
      if ((int)uVar3 < (int)uVar12) {
        uVar9 = uVar3;
      }
      if (SBORROW4(uVar3,-uVar12) != (int)(uVar3 + uVar12) < 0) {
        uVar9 = -uVar12;
      }
    case MIRRORED_REPEAT_GL:
      iVar6 = (int)uVar9 % (int)(uVar12 * 2);
      uVar9 = (iVar6 - uVar12) + (iVar6 >> 0x1f & uVar12 * 2);
      uVar9 = ~((int)uVar9 >> 0x1f ^ uVar9) + uVar12;
    }
  }
  if ((WVar1 == CLAMP_TO_BORDER) && ((int)uVar7 < 0 || (int)uVar12 <= (int)uVar7)) {
    TVar4 = getTextureChannelClass((this->m_format).type);
    switch(TVar4) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)&local_48,&this->m_format,sampler);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(local_78,&this->m_format,sampler);
      local_48.order = R;
      local_48.type = SNORM_INT8;
      aiStack_40[0] = 0;
      aiStack_40[1] = 0;
      lVar5 = 0;
      do {
        (&local_48.order)[lVar5] = (ChannelOrder)(float)*(int *)(local_78 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(local_78,&this->m_format,sampler);
      local_48.order = R;
      local_48.type = SNORM_INT8;
      aiStack_40[0] = 0;
      aiStack_40[1] = 0;
      lVar5 = 0;
      do {
        (&local_48.order)[lVar5] = (ChannelOrder)(float)*(uint *)(local_78 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      break;
    default:
      lVar5 = 0;
      do {
        (&local_48.order)[lVar5] = 0xbf800000;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)&local_48,(int)this,uVar7,offset->m_data[1]);
  }
  if ((int)uVar9 < (int)uVar12 && -1 < (int)uVar9 || WVar1 != CLAMP_TO_BORDER) {
    lookup((ConstPixelBufferAccess *)local_58,(int)this,uVar9,offset->m_data[1]);
  }
  else {
    TVar4 = getTextureChannelClass((this->m_format).type);
    switch(TVar4) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_58,&this->m_format,sampler);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(local_78,&this->m_format,sampler);
      local_58._0_4_ = R;
      local_58._4_4_ = SNORM_INT8;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      lVar5 = 0;
      do {
        *(float *)(local_58 + lVar5 * 4) = (float)*(int *)(local_78 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(local_78,&this->m_format,sampler);
      local_58._0_4_ = R;
      local_58._4_4_ = SNORM_INT8;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      lVar5 = 0;
      do {
        *(float *)(local_58 + lVar5 * 4) = (float)*(uint *)(local_78 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      break;
    default:
      lVar5 = 0;
      do {
        *(undefined4 *)(local_58 + lVar5 * 4) = 0xbf800000;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
  }
  fVar14 = (float)(&local_48.order)[sampler->compareChannel];
  if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar15 = 1.0;
    if (fVar14 <= 1.0) {
      fVar15 = fVar14;
    }
    fVar14 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar15);
  }
  fVar15 = local_68;
  if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar15 = 1.0;
    if (local_68 <= 1.0) {
      fVar15 = local_68;
    }
    fVar15 = (float)(~-(uint)(local_68 < 0.0) & (uint)fVar15);
  }
  iVar6 = sampler->compare - COMPAREMODE_LESS;
  switch(iVar6) {
  case 0:
    bVar10 = fVar14 < fVar15;
    goto LAB_001eb551;
  case 1:
    bVar10 = fVar14 < fVar15;
    goto LAB_001eb562;
  case 2:
    bVar10 = fVar15 < fVar14;
LAB_001eb551:
    bVar10 = !bVar10 && fVar15 != fVar14;
    break;
  case 3:
    bVar10 = fVar15 < fVar14;
LAB_001eb562:
    bVar10 = !bVar10;
    break;
  case 4:
    bVar10 = fVar15 == fVar14;
    break;
  case 5:
    bVar10 = fVar15 != fVar14;
    break;
  case 6:
    bVar10 = true;
    break;
  default:
    bVar10 = false;
  }
  fVar14 = *(float *)(local_58 + (long)sampler->compareChannel * 4);
  if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar15 = 1.0;
    if (fVar14 <= 1.0) {
      fVar15 = fVar14;
    }
    fVar14 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar15);
  }
  if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar15 = 1.0;
    if (local_68 <= 1.0) {
      fVar15 = local_68;
    }
    local_68 = (float)(~-(uint)(local_68 < 0.0) & (uint)fVar15);
  }
  switch(iVar6) {
  case 0:
    bVar11 = fVar14 < local_68;
    goto LAB_001eb5d9;
  case 1:
    bVar11 = fVar14 < local_68;
    goto LAB_001eb5ea;
  case 2:
    bVar11 = local_68 < fVar14;
LAB_001eb5d9:
    bVar11 = !bVar11 && local_68 != fVar14;
    break;
  case 3:
    bVar11 = local_68 < fVar14;
LAB_001eb5ea:
    bVar11 = !bVar11;
    break;
  case 4:
    bVar11 = local_68 == fVar14;
    break;
  case 5:
    bVar11 = local_68 != fVar14;
    break;
  case 6:
    bVar11 = true;
    break;
  default:
    bVar11 = false;
  }
  fVar14 = 1.0;
  if (!bVar10) {
    fVar14 = 0.0;
  }
  fVar13 = (s + -0.5) - fVar13;
  fVar15 = 1.0;
  if (!bVar11) {
    fVar15 = 0.0;
  }
  return fVar15 * fVar13 + fVar14 * (1.0 - fVar13);
}

Assistant:

float ConstPixelBufferAccess::sample1DCompare (const Sampler& sampler, Sampler::FilterMode filter, float ref, float s, const IVec2& offset) const
{
	// check selected layer exists
	// \note offset.x is X offset, offset.y is the selected layer
	DE_ASSERT(de::inBounds(offset.y(), 0, m_size.y()));

	// Format information for comparison function
	const bool isFixedPointDepth = isFixedPointDepthTextureFormat(m_format);

	// Non-normalized coordinates.
	float u = s;

	if (sampler.normalizedCoords)
		u = unnormalize(sampler.wrapS, s, m_size.x());

	switch (filter)
	{
		case Sampler::NEAREST:	return execCompare(sampleNearest1D(*this, sampler, u, offset), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		case Sampler::LINEAR:	return sampleLinear1DCompare(*this, sampler, ref, u, offset, isFixedPointDepth);
		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}